

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O3

void test_clear_clipping(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  puts("Testing clip-regions with Clear_Area():");
  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&black,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xf8))(d1,10,10,0x118,0xb4);
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  (**(code **)(*(long *)d1 + 0xa0))();
  puts("  Hit RETURN 6 times to nest Am_Drawonable clipping,");
  printf("      while alternately drawing big rectangles and clearing:  ");
  Am_Style::Am_Style(local_48,(Am_Style *)&red);
  Am_Style::Am_Style(local_50,(Am_Style *)&red);
  Am_Style::Am_Style(local_58,(Am_Style *)&blue);
  Am_Style::Am_Style(local_60,(Am_Style *)&blue);
  Am_Style::Am_Style(local_68,(Am_Style *)&red);
  Am_Style::Am_Style(local_70,(Am_Style *)&red);
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  set_style_array(local_48,local_50,local_58,local_60,local_68,local_70,local_38,local_40);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  iVar1 = 0x122;
  puVar4 = style_array;
  uVar2 = 0;
  do {
    getchar();
    uVar3 = uVar2 + 1;
    printf("%d  ",uVar3 & 0xffffffff);
    (**(code **)(*(long *)d1 + 0x108))(d1,0,0,iVar1,iVar1 + -100);
    if ((uVar2 & 1) == 0) {
      (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,puVar4,0,0,300,200,0);
    }
    else {
      (**(code **)(*(long *)d1 + 0x98))
                (d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
    }
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar1 = iVar1 + -0x14;
    puVar4 = puVar4 + 8;
    uVar2 = uVar3;
  } while (uVar3 != 6);
  putchar(10);
  return;
}

Assistant:

void
test_clear_clipping()
{
  printf("Testing clip-regions with Clear_Area():\n");

  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();

  d1->Clear_Clip();
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Set_Clip(10, 10, 280, 180);
  clear_whole_window(d1);
  ;
  d1->Flush_Output();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping,\n");
  printf("      while alternately drawing big rectangles and clearing:  ");
  set_style_array(red, red, blue, blue, red, red);

  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(0, 0, 290 - 20 * counter, 190 - 20 * counter);
    if (counter % 2)
      clear_whole_window(d1);
    else
      d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}